

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O1

void isaac_gen_group(isaacctx *ctx)

{
  long lVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t *puVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  int iVar11;
  uint32_t *puVar12;
  uint uVar13;
  bool bVar14;
  
  uVar9 = ctx->a;
  uVar4 = ctx->c + 1;
  ctx->c = uVar4;
  uVar4 = uVar4 + ctx->b;
  puVar7 = ctx->mem + 0x80;
  puVar2 = ctx->rsl;
  uVar8 = 0x404;
  puVar12 = ctx->mem;
  do {
    puVar3 = puVar2;
    uVar6 = *puVar12;
    uVar10 = (uVar9 << 0xd ^ uVar9) + *puVar7;
    uVar5 = uVar4 + uVar10 + *(int *)((long)ctx->mem + (ulong)(uVar6 & 0x3fc));
    *puVar12 = uVar5;
    uVar9 = uVar6 + *(int *)((long)ctx->mem + (ulong)(uVar5 >> 8 & 0x3fc));
    *puVar3 = uVar9;
    lVar1 = uVar8 + 0xc;
    uVar6 = *(uint *)((long)ctx->rsl + uVar8);
    uVar10 = (uVar10 >> 6 ^ uVar10) + puVar7[1];
    uVar5 = uVar9 + uVar10 + *(int *)((long)ctx->mem + (ulong)(uVar6 & 0x3fc));
    *(uint *)((long)ctx->rsl + uVar8) = uVar5;
    uVar9 = uVar6 + *(int *)((long)ctx->mem + (ulong)(uVar5 >> 8 & 0x3fc));
    puVar3[1] = uVar9;
    uVar6 = *(uint *)((long)ctx->rsl + uVar8 + 4);
    uVar10 = (uVar10 * 4 ^ uVar10) + puVar7[2];
    uVar5 = uVar9 + uVar10 + *(int *)((long)ctx->mem + (ulong)(uVar6 & 0x3fc));
    *(uint *)((long)ctx->rsl + uVar8 + 4) = uVar5;
    uVar4 = uVar6 + *(int *)((long)ctx->mem + (ulong)(uVar5 >> 8 & 0x3fc));
    puVar3[2] = uVar4;
    uVar6 = puVar12[3];
    uVar9 = (uVar10 >> 0x10 ^ uVar10) + puVar7[3];
    uVar5 = uVar4 + uVar9 + *(int *)((long)ctx->mem + (ulong)(uVar6 & 0x3fc));
    puVar7 = puVar7 + 4;
    puVar12[3] = uVar5;
    uVar4 = uVar6 + *(int *)((long)ctx->mem + (ulong)(uVar5 >> 8 & 0x3fc));
    puVar3[3] = uVar4;
    bVar14 = uVar8 < 0x5f4;
    puVar2 = puVar3 + 4;
    uVar8 = uVar8 + 0x10;
    puVar12 = (uint32_t *)((long)ctx->rsl + lVar1);
  } while (bVar14);
  uVar8 = 0x3f4;
  do {
    uVar13 = (uVar9 << 0xd ^ uVar9) + *(int *)((long)ctx->rsl + uVar8 + 0xc);
    uVar6 = *(uint *)((long)puVar3 + uVar8 + 0x1c);
    uVar10 = uVar4 + uVar13 + *(int *)((long)ctx->mem + (ulong)(uVar6 & 0x3fc));
    uVar5 = *(uint *)((long)puVar3 + uVar8 + 0x20);
    *(uint *)((long)puVar3 + uVar8 + 0x1c) = uVar10;
    iVar11 = uVar6 + *(int *)((long)ctx->mem + (ulong)(uVar10 >> 8 & 0x3fc));
    *(int *)((long)puVar3 + (uVar8 - 0x3e4)) = iVar11;
    uVar6 = (uVar13 >> 6 ^ uVar13) + *(int *)((long)ctx->rsl + uVar8 + 0x10);
    uVar10 = iVar11 + uVar6 + *(int *)((long)ctx->mem + (ulong)(uVar5 & 0x3fc));
    *(uint *)((long)puVar3 + uVar8 + 0x20) = uVar10;
    iVar11 = uVar5 + *(int *)((long)ctx->mem + (ulong)(uVar10 >> 8 & 0x3fc));
    *(int *)((long)puVar3 + (uVar8 - 0x3e0)) = iVar11;
    uVar10 = (uVar6 * 4 ^ uVar6) + *(int *)((long)ctx->rsl + uVar8 + 0x14);
    uVar6 = *(uint *)((long)puVar3 + uVar8 + 0x24);
    uVar5 = iVar11 + uVar10 + *(int *)((long)ctx->mem + (ulong)(uVar6 & 0x3fc));
    *(uint *)((long)puVar3 + uVar8 + 0x24) = uVar5;
    iVar11 = uVar6 + *(int *)((long)ctx->mem + (ulong)(uVar5 >> 8 & 0x3fc));
    *(int *)((long)puVar3 + (uVar8 - 0x3dc)) = iVar11;
    uVar6 = *(uint *)((long)puVar3 + uVar8 + 0x28);
    uVar9 = (uVar10 >> 0x10 ^ uVar10) + *(int *)((long)ctx->rsl + uVar8 + 0x18);
    uVar5 = iVar11 + uVar9 + *(int *)((long)ctx->mem + (ulong)(uVar6 & 0x3fc));
    *(uint *)((long)puVar3 + uVar8 + 0x28) = uVar5;
    uVar4 = uVar6 + *(int *)((long)ctx->mem + (ulong)(uVar5 >> 8 & 0x3fc));
    *(uint32_t *)((long)puVar3 + (uVar8 - 0x3d8)) = uVar4;
    uVar8 = uVar8 + 0x10;
  } while (uVar8 < 0x5f4);
  ctx->b = uVar4;
  ctx->a = uVar9;
  return;
}

Assistant:

void isaac_gen_group(isaacctx *ctx)
{
    uint32_t a;
    uint32_t b;
    uint32_t x;
    uint32_t y;
    uint32_t *m;
    uint32_t *mm;
    uint32_t *m2;
    uint32_t *r;
    uint32_t *mend;

    mm = ctx->mem;
    r = ctx->rsl;
    a = ctx->a;
    b = (ctx->b + (++ctx->c)) & 0xffffffff;
    for (m = mm, mend = m2 = m + (ISAAC_RANDSIZ/2) ; m<mend ; )
    {
        isaac_step(a<<13, a, b, mm, m, m2, r, x);
        isaac_step(a>>6,  a, b, mm, m, m2, r, x);
        isaac_step(a<<2,  a, b, mm, m, m2, r, x);
        isaac_step(a>>16, a, b, mm, m, m2, r, x);
    }
    for (m2 = mm; m2<mend; )
    {
        isaac_step(a<<13, a, b, mm, m, m2, r, x);
        isaac_step(a>>6,  a, b, mm, m, m2, r, x);
        isaac_step(a<<2,  a, b, mm, m, m2, r, x);
        isaac_step(a>>16, a, b, mm, m, m2, r, x);
    }
    ctx->b = b;
    ctx->a = a;
}